

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall
PSVIWriterHandlers::processAttributes
          (PSVIWriterHandlers *this,PSVIAttributeList *psviAttributes,
          RefVectorOf<AttrInfo> *attributesInfo)

{
  ValueVectorOf<unsigned_long> *pVVar1;
  wchar16 *value;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  PSVIAttributeList *pPVar2;
  AttrInfo *pAVar3;
  char16_t *value_00;
  long lVar4;
  PSVIAttribute *attrPSVI;
  XMLCh *pXVar5;
  ulong local_48;
  uint local_3c;
  PSVIAttributeList *local_38;
  
  pVVar1 = this->fNSAttributes;
  pVVar1->fCurCount = 0;
  local_3c = (uint)CONCAT71((int7)((ulong)pVVar1 >> 8),1);
  local_38 = psviAttributes;
  for (local_48 = 0; local_48 < (attributesInfo->super_BaseRefVectorOf<AttrInfo>).fCurCount;
      local_48 = local_48 + 1) {
    pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                       (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,local_48);
    if (pAVar3->uri == (XMLCh *)&xercesc_4_0::XMLUni::fgXMLNSURIName) {
      xercesc_4_0::ValueVectorOf<unsigned_long>::addElement(this->fNSAttributes,&local_48);
    }
    else {
      if ((local_3c & 1) != 0) {
        sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
        local_3c = 0;
      }
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                         (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,local_48);
      value = pAVar3->name;
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                         (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,local_48);
      pXVar5 = pAVar3->uri;
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,pXVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,value);
      this_00 = this->fPrefixMap;
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                         (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,local_48);
      value_00 = xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                           (this_00,pAVar3->uri);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,value_00);
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                         (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,local_48);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pAVar3->value);
      pPVar2 = local_38;
      pXVar5 = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
      if (local_38 != (PSVIAttributeList *)0x0) {
        lVar4 = xercesc_4_0::PSVIAttributeList::getAttributePSVIAtIndex((ulong)local_38);
        pXVar5 = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
        if (lVar4 != 0) {
          lVar4 = xercesc_4_0::PSVIAttributeList::getAttributePSVIAtIndex((ulong)pPVar2);
          pXVar5 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
          if (*(char *)(lVar4 + 0x38) != '\0') {
            pXVar5 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
          }
        }
      }
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar5);
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                         (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,local_48);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pAVar3->type);
      sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
      attrPSVI = (PSVIAttribute *)
                 xercesc_4_0::PSVIAttributeList::getAttributePSVIByName((wchar16 *)pPVar2,value);
      processAttributePSVI(this,attrPSVI);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
    }
  }
  if ((local_3c & 1) == 0) {
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
  }
  else {
    writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
  }
  processNamespaceAttributes(this,local_38,attributesInfo);
  return;
}

Assistant:

void PSVIWriterHandlers::processAttributes(PSVIAttributeList* psviAttributes, const RefVectorOf<AttrInfo>* attributesInfo) {
	fNSAttributes->removeAllElements();  //will store the indecies of namespace attributes
	bool firstFlag = true;
	for (XMLSize_t i = 0; i < attributesInfo->size(); i++) {
		if (attributesInfo->elementAt(i)->getUri() == XMLUni::fgXMLNSURIName) {
			fNSAttributes->addElement(i);
		} else {
			if (firstFlag) {
				sendIndentedElement(PSVIUni::fgAttributes);
				firstFlag = false;
			}
			const XMLCh* localName = attributesInfo->elementAt(i)->getLocalName();
			const XMLCh* namespaceUri = attributesInfo->elementAt(i)->getUri();
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, namespaceUri);
			sendElementValue(PSVIUni::fgLocalName, localName);
			sendElementValue(PSVIUni::fgPrefix, fPrefixMap->get(attributesInfo->elementAt(i)->getUri()));
			sendElementValue(PSVIUni::fgNormalizedValue, attributesInfo->elementAt(i)->getValue());
			if (psviAttributes!=NULL && psviAttributes->getAttributePSVIAtIndex(i)!=NULL) {
				sendElementValue(PSVIUni::fgSpecified,
					translateBool(!(psviAttributes->getAttributePSVIAtIndex(i)->getIsSchemaSpecified())));
			} else //the desired value is !schemaSpecified
				sendElementValue(PSVIUni::fgSpecified, PSVIUni::fgUnknown);
			sendElementValue(PSVIUni::fgAttributeType, attributesInfo->elementAt(i)->getType());
			sendElementEmpty(PSVIUni::fgReferences);
			PSVIAttribute* psviAttr = psviAttributes->getAttributePSVIByName(localName, namespaceUri);
			processAttributePSVI(psviAttr);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
	}
	if (firstFlag)
		writeEmpty(PSVIUni::fgAttributes);
	else
		sendUnindentedElement(PSVIUni::fgAttributes);
	processNamespaceAttributes(psviAttributes, attributesInfo);
}